

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_queue_remove_timeout(event_base *base,event *ev)

{
  int iVar1;
  common_timeout_list *pcVar2;
  common_timeout_list *ctl;
  event *ev_local;
  event_base *base_local;
  
  if (((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar1 = evthread_is_debug_lock_held_(base->th_base_lock), iVar1 == 0)) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xcc8,"evthread_is_debug_lock_held_((base)->th_base_lock)",
               "event_queue_remove_timeout");
  }
  if (((ev->ev_evcallback).evcb_flags & 1U) != 0) {
    base->event_count =
         base->event_count - (uint)((((ev->ev_evcallback).evcb_flags & 0x10U) != 0 ^ 0xffU) & 1);
    (ev->ev_evcallback).evcb_flags = (ev->ev_evcallback).evcb_flags & 0xfffe;
    iVar1 = is_common_timeout(&ev->ev_timeout,base);
    if (iVar1 == 0) {
      min_heap_erase_(&base->timeheap,ev);
    }
    else {
      pcVar2 = get_common_timeout_list(base,&ev->ev_timeout);
      if ((ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next == (event *)0x0) {
        (pcVar2->events).tqh_last = (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev;
      }
      else {
        (((ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next)->ev_timeout_pos).
        ev_next_with_common_timeout.tqe_prev =
             (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev;
      }
      *(ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev =
           (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
    }
    return;
  }
  event_errx(1,"%s: %p(fd %d) not on queue %x","event_queue_remove_timeout",ev,
             (ulong)(uint)ev->ev_fd);
}

Assistant:

static void
event_queue_remove_timeout(struct event_base *base, struct event *ev)
{
	EVENT_BASE_ASSERT_LOCKED(base);
	if (EVUTIL_FAILURE_CHECK(!(ev->ev_flags & EVLIST_TIMEOUT))) {
		event_errx(1, "%s: %p(fd "EV_SOCK_FMT") not on queue %x", __func__,
		    ev, EV_SOCK_ARG(ev->ev_fd), EVLIST_TIMEOUT);
		return;
	}
	DECR_EVENT_COUNT(base, ev->ev_flags);
	ev->ev_flags &= ~EVLIST_TIMEOUT;

	if (is_common_timeout(&ev->ev_timeout, base)) {
		struct common_timeout_list *ctl =
		    get_common_timeout_list(base, &ev->ev_timeout);
		TAILQ_REMOVE(&ctl->events, ev,
		    ev_timeout_pos.ev_next_with_common_timeout);
	} else {
		min_heap_erase_(&base->timeheap, ev);
	}
}